

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

unsigned_long_long
pugi::impl::anon_unknown_0::string_to_integer<unsigned_long_long>
          (char_t *value,unsigned_long_long minv,unsigned_long_long maxv)

{
  byte bVar1;
  byte bVar2;
  unsigned_long_long uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  char_t *s;
  byte *pbVar7;
  ulong uVar8;
  char_t *pcVar9;
  byte bVar10;
  char_t *pcVar11;
  bool bVar12;
  
  lVar5 = 0;
  do {
    lVar4 = lVar5;
    bVar1 = value[lVar4];
    lVar5 = lVar4 + 1;
  } while (((anonymous_namespace)::chartype_table[bVar1] & 8) != 0);
  uVar6 = (ulong)((bVar1 - 0x2b & 0xfd) == 0);
  if ((value[lVar4 + uVar6] == '0') && ((value[lVar5 + uVar6] & 0xdf) == 0x58)) {
    pbVar7 = value + lVar4 + 2 + uVar6;
    do {
      bVar10 = *pbVar7;
      pbVar7 = pbVar7 + 1;
    } while (bVar10 == 0x30);
    uVar8 = 0;
    uVar6 = 0;
    do {
      if (bVar10 - 0x30 < 10) {
        uVar6 = uVar6 << 4 | (ulong)(bVar10 - 0x30);
      }
      else {
        if (5 < (bVar10 | 0x20) - 0x61) goto LAB_0011047d;
        uVar6 = uVar6 * 0x10 + (ulong)((bVar10 | 0x20) - 0x57);
      }
      bVar10 = *pbVar7;
      uVar8 = uVar8 + 1;
      pbVar7 = pbVar7 + 1;
    } while( true );
  }
  pcVar9 = (char_t *)(uVar6 + lVar5);
  do {
    pcVar11 = pcVar9;
    bVar10 = value[(long)(pcVar11 + -1)];
    pcVar9 = pcVar11 + 1;
  } while (bVar10 == 0x30);
  pcVar11 = value + (long)(pcVar11 + -1);
  uVar6 = 0;
  bVar2 = bVar10;
  while (bVar2 - 0x30 < 10) {
    uVar6 = (ulong)(bVar2 - 0x30) + uVar6 * 10;
    pbVar7 = pcVar11 + 1;
    pcVar11 = pcVar11 + 1;
    bVar2 = *pbVar7;
  }
  if ((char_t *)0x13 < pcVar11 + (-(long)pcVar9 - (long)value) + 2) {
    bVar12 = true;
    if (pcVar11 + (-0x12 - (long)value) != pcVar9) goto LAB_00110499;
    if (0x30 < bVar10) {
      bVar12 = -1 < (long)uVar6 || bVar10 != 0x31;
      goto LAB_00110499;
    }
  }
  bVar12 = false;
LAB_00110499:
  if (bVar1 != 0x2d) {
    if (maxv <= uVar6) {
      uVar6 = maxv;
    }
    if (bVar12) {
      uVar6 = maxv;
    }
    return uVar6;
  }
  uVar3 = -uVar6;
  if (-minv < uVar6) {
    uVar3 = minv;
  }
  if (bVar12) {
    uVar3 = minv;
  }
  return uVar3;
LAB_0011047d:
  bVar12 = 0x10 < uVar8;
  goto LAB_00110499;
}

Assistant:

PUGI__FN PUGI__UNSIGNED_OVERFLOW U string_to_integer(const char_t* value, U minv, U maxv)
	{
		U result = 0;
		const char_t* s = value;

		while (PUGI__IS_CHARTYPE(*s, ct_space))
			s++;

		bool negative = (*s == '-');

		s += (*s == '+' || *s == '-');

		bool overflow = false;

		if (s[0] == '0' && (s[1] | ' ') == 'x')
		{
			s += 2;

			// since overflow detection relies on length of the sequence skip leading zeros
			while (*s == '0')
				s++;

			const char_t* start = s;

			for (;;)
			{
				if (static_cast<unsigned>(*s - '0') < 10)
					result = result * 16 + (*s - '0');
				else if (static_cast<unsigned>((*s | ' ') - 'a') < 6)
					result = result * 16 + ((*s | ' ') - 'a' + 10);
				else
					break;

				s++;
			}

			size_t digits = static_cast<size_t>(s - start);

			overflow = digits > sizeof(U) * 2;
		}
		else
		{
			// since overflow detection relies on length of the sequence skip leading zeros
			while (*s == '0')
				s++;

			const char_t* start = s;

			for (;;)
			{
				if (static_cast<unsigned>(*s - '0') < 10)
					result = result * 10 + (*s - '0');
				else
					break;

				s++;
			}

			size_t digits = static_cast<size_t>(s - start);

			PUGI__STATIC_ASSERT(sizeof(U) == 8 || sizeof(U) == 4 || sizeof(U) == 2);

			const size_t max_digits10 = sizeof(U) == 8 ? 20 : sizeof(U) == 4 ? 10 : 5;
			const char_t max_lead = sizeof(U) == 8 ? '1' : sizeof(U) == 4 ? '4' : '6';
			const size_t high_bit = sizeof(U) * 8 - 1;

			overflow = digits >= max_digits10 && !(digits == max_digits10 && (*start < max_lead || (*start == max_lead && result >> high_bit)));
		}

		if (negative)
		{
			// Workaround for crayc++ CC-3059: Expected no overflow in routine.
		#ifdef _CRAYC
			return (overflow || result > ~minv + 1) ? minv : ~result + 1;
		#else
			return (overflow || result > 0 - minv) ? minv : 0 - result;
		#endif
		}
		else
			return (overflow || result > maxv) ? maxv : result;
	}